

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_234::GUFAOptimizer::visitFunction(GUFAOptimizer *this,Function *func)

{
  undefined1 local_1a0 [8];
  PassRunner runner;
  string local_60;
  string local_40;
  allocator<char> local_19;
  
  if (this->optimized == true) {
    ReFinalize::ReFinalize((ReFinalize *)local_1a0);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
               &runner.passes.
                super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,func,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
               ).
               super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .currModule);
    ReFinalize::~ReFinalize((ReFinalize *)local_1a0);
    EHUtils::handleBlockNestedPops
              (func,(this->
                    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                    ).
                    super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                    .currModule);
    if (this->optimizing != false) {
      PassRunner::PassRunner
                ((PassRunner *)local_1a0,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                 ).super_Pass.runner);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"dce",&local_19);
      PassRunner::add((PassRunner *)local_1a0,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"vacuum",&local_19);
      PassRunner::add((PassRunner *)local_1a0,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      PassRunner::runOnFunction((PassRunner *)local_1a0,func);
      PassRunner::~PassRunner((PassRunner *)local_1a0);
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (!optimized) {
      return;
    }

    // Optimization may introduce more unreachables, which we need to
    // propagate.
    ReFinalize().walkFunctionInModule(func, getModule());

    // We may add blocks around pops, which we must fix up.
    EHUtils::handleBlockNestedPops(func, *getModule());

    // If we are in "optimizing" mode, we'll also run some more passes on this
    // function that we just optimized. If not, leave now.
    if (!optimizing) {
      return;
    }

    PassRunner runner(getPassRunner());
    // New unreachables we added have created dead code we can remove. If we do
    // not do this, then running GUFA repeatedly can actually increase code size
    // (by adding multiple unneeded unreachables).
    runner.add("dce");
    // New drops we added allow us to remove more unused code and values. As
    // with unreachables, without a vacuum we may increase code size as in
    // nested expressions we may apply the same value multiple times:
    //
    //  (block $out
    //   (block $in
    //    (i32.const 10)))
    //
    // In each of the blocks we'll infer the value must be 10, so we'll end up
    // with this repeating code:
    //
    //  (block ;; a new block just to drop the old outer block
    //   (drop
    //    (block $out
    //     (drop
    //      (block $in
    //       (i32.const 10)
    //      )
    //     )
    //     (i32.const 10)
    //    )
    //   )
    //   (i32.const 10)
    //  )
    runner.add("vacuum");
    runner.runOnFunction(func);
  }